

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommand.h
# Opt level: O2

void __thiscall cmFLTKWrapUICommand::cmFLTKWrapUICommand(cmFLTKWrapUICommand *this)

{
  (this->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (this->super_cmCommand).Error._M_dataplus._M_p = (pointer)&(this->super_cmCommand).Error.field_2;
  (this->super_cmCommand).Error._M_string_length = 0;
  (this->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (this->super_cmCommand)._vptr_cmCommand = (_func_int **)&PTR__cmFLTKWrapUICommand_00646a38;
  (this->GeneratedSourcesClasses).
  super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->GeneratedSourcesClasses).
  super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->GeneratedSourcesClasses).
  super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Target)._M_dataplus._M_p = (pointer)&(this->Target).field_2;
  (this->Target)._M_string_length = 0;
  (this->Target).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

cmCommand()
    : Makefile(CM_NULLPTR)
  {
  }